

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall QPDFObjectHandle::warnIfPossible(QPDFObjectHandle *this,string *warning)

{
  QPDFObject *this_00;
  QPDF *qpdf;
  bool bVar1;
  Pipeline *this_01;
  allocator<char> local_d9;
  QPDF *context;
  string local_d0;
  string description;
  undefined1 local_90 [128];
  
  context = (QPDF *)0x0;
  description._M_dataplus._M_p = (pointer)&description.field_2;
  description._M_string_length = 0;
  description.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 != (QPDFObject *)0x0) {
    bVar1 = QPDFObject::getDescription(this_00,&context,&description);
    qpdf = context;
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d9);
      QPDFExc::QPDFExc((QPDFExc *)local_90,qpdf_e_damaged_pdf,&local_d0,&description,0,warning);
      warn(qpdf,(QPDFExc *)local_90);
      QPDFExc::~QPDFExc((QPDFExc *)local_90);
      std::__cxx11::string::~string((string *)&local_d0);
      goto LAB_00198c41;
    }
  }
  QPDFLogger::defaultLogger();
  QPDFLogger::getError((QPDFLogger *)local_90,(bool)local_d0._M_dataplus._M_p._0_1_);
  this_01 = Pipeline::operator<<((Pipeline *)local_90._0_8_,warning);
  Pipeline::operator<<(this_01,"\n");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_d0 + 8));
LAB_00198c41:
  std::__cxx11::string::~string((string *)&description);
  return;
}

Assistant:

void
QPDFObjectHandle::warnIfPossible(std::string const& warning) const
{
    QPDF* context = nullptr;
    std::string description;
    if (obj && obj->getDescription(context, description)) {
        warn(context, QPDFExc(qpdf_e_damaged_pdf, "", description, 0, warning));
    } else {
        *QPDFLogger::defaultLogger()->getError() << warning << "\n";
    }
}